

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::TryCastToBit::Operation<duckdb::string_t,_duckdb::string_t>
               (string_t input,string_t *result,Vector *result_vector,CastParameters *parameters)

{
  string_t str;
  bool bVar1;
  undefined8 in_RCX;
  undefined8 *in_RDX;
  bitstring_t *in_R8;
  string_t sVar2;
  idx_t result_size;
  string *in_stack_000000a0;
  idx_t *in_stack_000000a8;
  undefined1 in_stack_000000b0 [16];
  idx_t in_stack_ffffffffffffff98;
  Vector *in_stack_ffffffffffffffa0;
  undefined8 local_58;
  
  bVar1 = Bit::TryGetBitStringSize((string_t)in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  if (bVar1) {
    sVar2 = StringVector::EmptyString(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_58 = sVar2.value._0_8_;
    *in_RDX = local_58;
    in_RDX[1] = sVar2.value._8_8_;
    str.value.pointer.ptr = (char *)in_RDX;
    str.value._0_8_ = in_RCX;
    Bit::ToBit(str,in_R8);
    string_t::Finalize(sVar2.value._8_8_);
  }
  return bVar1;
}

Assistant:

bool TryCastToBit::Operation(string_t input, string_t &result, Vector &result_vector, CastParameters &parameters) {
	idx_t result_size;
	if (!Bit::TryGetBitStringSize(input, result_size, parameters.error_message)) {
		return false;
	}

	result = StringVector::EmptyString(result_vector, result_size);
	Bit::ToBit(input, result);
	result.Finalize();
	return true;
}